

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pkcs8.cc
# Opt level: O2

int pkcs12_key_gen(char *pass,size_t pass_len,uint8_t *salt,size_t salt_len,uint8_t id,
                  uint32_t iterations,size_t out_len,uint8_t *out,EVP_MD *md)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  size_t __n;
  void *pvVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  uint8_t *__n_00;
  ulong uVar8;
  uint8_t *puVar9;
  uint A_len;
  void *local_1c8;
  uint8_t *local_1c0;
  size_t local_1b8;
  size_t pass_raw_len;
  uint8_t *pass_raw;
  uint8_t *local_1a0;
  uint8_t A [64];
  EVP_MD_CTX ctx;
  uint8_t D [128];
  CBS cbs;
  undefined4 extraout_var;
  
  if (iterations == 0) {
    ERR_put_error(0x13,0,0x81,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                  ,0x44);
    return 0;
  }
  local_1c0 = salt;
  EVP_MD_CTX_init((EVP_MD_CTX *)&ctx);
  pass_raw = (uint8_t *)0x0;
  pass_raw_len = 0;
  if (pass == (char *)0x0) {
LAB_002d259a:
    iVar2 = EVP_MD_block_size((EVP_MD *)md);
    __n = CONCAT44(extraout_var,iVar2);
    if (__n != 0) {
      memset(D,(uint)id,__n);
    }
    uVar8 = (salt_len + __n) - 1;
    if (uVar8 < salt_len) {
LAB_002d25e1:
      iVar2 = 0x6a;
    }
    else {
      uVar1 = __n - 1;
      if (CARRY8(pass_raw_len,uVar1)) goto LAB_002d25e1;
      uVar8 = uVar8 - uVar8 % __n;
      uVar7 = (pass_raw_len + uVar1) - (pass_raw_len + uVar1) % __n;
      if (!CARRY8(uVar7,uVar8)) {
        local_1b8 = uVar7 + uVar8;
        pvVar4 = OPENSSL_malloc(uVar7 + uVar8);
        if (local_1b8 == 0 || pvVar4 != (void *)0x0) {
          local_1a0 = out;
          for (uVar5 = 0; uVar5 < uVar8; uVar5 = uVar5 + 1) {
            *(uint8_t *)((long)pvVar4 + uVar5) = local_1c0[uVar5 % salt_len];
          }
          for (uVar5 = 0; uVar5 < uVar7; uVar5 = uVar5 + 1) {
            *(uint8_t *)((long)pvVar4 + uVar5 + uVar8) = pass_raw[uVar5 % pass_raw_len];
          }
          iVar2 = 1;
          local_1c8 = pvVar4;
          while (pvVar4 = local_1c8, (uint8_t *)out_len != (uint8_t *)0x0) {
            local_1c0 = (uint8_t *)out_len;
            iVar3 = EVP_DigestInit_ex((EVP_MD_CTX *)&ctx,(EVP_MD *)md,(ENGINE *)0x0);
            if ((((iVar3 == 0) || (iVar3 = EVP_DigestUpdate((EVP_MD_CTX *)&ctx,D,__n), iVar3 == 0))
                || (iVar3 = EVP_DigestUpdate((EVP_MD_CTX *)&ctx,local_1c8,local_1b8), iVar3 == 0))
               || (iVar3 = EVP_DigestFinal_ex((EVP_MD_CTX *)&ctx,A,&A_len), iVar3 == 0)) {
LAB_002d2883:
              iVar2 = 0;
              pvVar4 = local_1c8;
              break;
            }
            uVar6 = 0;
            while (uVar6 = uVar6 + 1, uVar6 < iterations) {
              iVar3 = EVP_DigestInit_ex((EVP_MD_CTX *)&ctx,(EVP_MD *)md,(ENGINE *)0x0);
              if (((iVar3 == 0) ||
                  (iVar3 = EVP_DigestUpdate((EVP_MD_CTX *)&ctx,A,(ulong)A_len), iVar3 == 0)) ||
                 (iVar3 = EVP_DigestFinal_ex((EVP_MD_CTX *)&ctx,A,&A_len), iVar3 == 0))
              goto LAB_002d2883;
            }
            puVar9 = (uint8_t *)(ulong)A_len;
            __n_00 = puVar9;
            if (local_1c0 < puVar9) {
              __n_00 = local_1c0;
            }
            if (puVar9 != (uint8_t *)0x0) {
              memcpy(local_1a0,A,(size_t)__n_00);
            }
            out_len = (size_t)(local_1c0 + -(long)__n_00);
            pvVar4 = local_1c8;
            if ((uint8_t *)out_len == (uint8_t *)0x0) break;
            local_1a0 = local_1a0 + (long)__n_00;
            for (uVar8 = 0; __n != uVar8; uVar8 = uVar8 + 1) {
              *(uint8_t *)((long)&cbs.data + uVar8) = A[uVar8 % (ulong)puVar9];
            }
            if (local_1b8 % __n != 0) {
              __assert_fail("I_len % block_size == 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                            ,0xa6,
                            "int pkcs12_key_gen(const char *, size_t, const uint8_t *, size_t, uint8_t, uint32_t, size_t, uint8_t *, const EVP_MD *)"
                           );
            }
            for (uVar8 = 0; uVar8 < local_1b8; uVar8 = uVar8 + __n) {
              uVar6 = 1;
              for (uVar7 = uVar1; uVar7 < __n; uVar7 = uVar7 - 1) {
                uVar6 = (uint)*(byte *)((long)&cbs.data + uVar7) +
                        uVar6 + *(byte *)((long)pvVar4 + uVar7);
                *(char *)((long)pvVar4 + uVar7) = (char)uVar6;
                uVar6 = uVar6 >> 8;
              }
              pvVar4 = (void *)((long)pvVar4 + __n);
            }
          }
        }
        else {
LAB_002d2681:
          iVar2 = 0;
          pvVar4 = (void *)0x0;
        }
        goto LAB_002d25fe;
      }
      iVar2 = 0x71;
    }
    ERR_put_error(0x13,0,0x45,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                  ,iVar2);
  }
  else {
    CBB_zero((CBB *)D);
    iVar2 = CBB_init((CBB *)D,pass_len * 2);
    if (iVar2 != 0) {
      cbs.data = (uint8_t *)pass;
      cbs.len = pass_len;
      do {
        if (cbs.len == 0) {
          iVar2 = CBB_add_ucs2_be((CBB *)D,0);
          if (iVar2 == 0) goto LAB_002d2542;
          iVar2 = CBB_finish((CBB *)D,&pass_raw,&pass_raw_len);
          CBB_cleanup((CBB *)D);
          if (iVar2 != 0) goto LAB_002d259a;
          goto LAB_002d2681;
        }
        iVar2 = CBS_get_utf8(&cbs,(uint32_t *)A);
      } while ((iVar2 != 0) && (iVar2 = CBB_add_ucs2_be((CBB *)D,A._0_4_), iVar2 != 0));
      ERR_put_error(0x13,0,0x83,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/pkcs8/pkcs8.cc"
                    ,0x30);
    }
LAB_002d2542:
    CBB_cleanup((CBB *)D);
  }
  iVar2 = 0;
  pvVar4 = (void *)0x0;
LAB_002d25fe:
  OPENSSL_free(pvVar4);
  OPENSSL_free(pass_raw);
  EVP_MD_CTX_cleanup((EVP_MD_CTX *)&ctx);
  return iVar2;
}

Assistant:

int pkcs12_key_gen(const char *pass, size_t pass_len, const uint8_t *salt,
                   size_t salt_len, uint8_t id, uint32_t iterations,
                   size_t out_len, uint8_t *out, const EVP_MD *md) {
  // See https://tools.ietf.org/html/rfc7292#appendix-B. Quoted parts of the
  // specification have errata applied and other typos fixed.

  if (iterations < 1) {
    OPENSSL_PUT_ERROR(PKCS8, PKCS8_R_BAD_ITERATION_COUNT);
    return 0;
  }

  int ret = 0;
  EVP_MD_CTX ctx;
  EVP_MD_CTX_init(&ctx);
  uint8_t *pass_raw = NULL, *I = NULL;
  size_t pass_raw_len = 0, I_len = 0;

  {
    // If |pass| is NULL, we use the empty string rather than {0, 0} as the raw
    // password.
    if (pass != NULL &&
        !pkcs12_encode_password(pass, pass_len, &pass_raw, &pass_raw_len)) {
      goto err;
    }

    // In the spec, |block_size| is called "v", but measured in bits.
    size_t block_size = EVP_MD_block_size(md);

    // 1. Construct a string, D (the "diversifier"), by concatenating v/8 copies
    // of ID.
    uint8_t D[EVP_MAX_MD_BLOCK_SIZE];
    OPENSSL_memset(D, id, block_size);

    // 2. Concatenate copies of the salt together to create a string S of length
    // v(ceiling(s/v)) bits (the final copy of the salt may be truncated to
    // create S). Note that if the salt is the empty string, then so is S.
    //
    // 3. Concatenate copies of the password together to create a string P of
    // length v(ceiling(p/v)) bits (the final copy of the password may be
    // truncated to create P).  Note that if the password is the empty string,
    // then so is P.
    //
    // 4. Set I=S||P to be the concatenation of S and P.
    if (salt_len + block_size - 1 < salt_len ||
        pass_raw_len + block_size - 1 < pass_raw_len) {
      OPENSSL_PUT_ERROR(PKCS8, ERR_R_OVERFLOW);
      goto err;
    }
    size_t S_len = block_size * ((salt_len + block_size - 1) / block_size);
    size_t P_len = block_size * ((pass_raw_len + block_size - 1) / block_size);
    I_len = S_len + P_len;
    if (I_len < S_len) {
      OPENSSL_PUT_ERROR(PKCS8, ERR_R_OVERFLOW);
      goto err;
    }

    I = reinterpret_cast<uint8_t *>(OPENSSL_malloc(I_len));
    if (I_len != 0 && I == NULL) {
      goto err;
    }

    for (size_t i = 0; i < S_len; i++) {
      I[i] = salt[i % salt_len];
    }
    for (size_t i = 0; i < P_len; i++) {
      I[i + S_len] = pass_raw[i % pass_raw_len];
    }

    while (out_len != 0) {
      // A. Set A_i=H^r(D||I). (i.e., the r-th hash of D||I,
      // H(H(H(... H(D||I))))
      uint8_t A[EVP_MAX_MD_SIZE];
      unsigned A_len;
      if (!EVP_DigestInit_ex(&ctx, md, NULL) ||
          !EVP_DigestUpdate(&ctx, D, block_size) ||
          !EVP_DigestUpdate(&ctx, I, I_len) ||
          !EVP_DigestFinal_ex(&ctx, A, &A_len)) {
        goto err;
      }
      for (uint32_t iter = 1; iter < iterations; iter++) {
        if (!EVP_DigestInit_ex(&ctx, md, NULL) ||
            !EVP_DigestUpdate(&ctx, A, A_len) ||
            !EVP_DigestFinal_ex(&ctx, A, &A_len)) {
          goto err;
        }
      }

      size_t todo = out_len < A_len ? out_len : A_len;
      OPENSSL_memcpy(out, A, todo);
      out += todo;
      out_len -= todo;
      if (out_len == 0) {
        break;
      }

      // B. Concatenate copies of A_i to create a string B of length v bits (the
      // final copy of A_i may be truncated to create B).
      uint8_t B[EVP_MAX_MD_BLOCK_SIZE];
      for (size_t i = 0; i < block_size; i++) {
        B[i] = A[i % A_len];
      }

      // C. Treating I as a concatenation I_0, I_1, ..., I_(k-1) of v-bit
      // blocks, where k=ceiling(s/v)+ceiling(p/v), modify I by setting
      // I_j=(I_j+B+1) mod 2^v for each j.
      assert(I_len % block_size == 0);
      for (size_t i = 0; i < I_len; i += block_size) {
        unsigned carry = 1;
        for (size_t j = block_size - 1; j < block_size; j--) {
          carry += I[i + j] + B[j];
          I[i + j] = (uint8_t)carry;
          carry >>= 8;
        }
      }
    }

    ret = 1;
  }

err:
  OPENSSL_free(I);
  OPENSSL_free(pass_raw);
  EVP_MD_CTX_cleanup(&ctx);
  return ret;
}